

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigPrintClass(Ivy_Obj_t *pClass)

{
  undefined8 uVar1;
  Ivy_Obj_t *local_18;
  Ivy_Obj_t *pObj;
  Ivy_Obj_t *pClass_local;
  
  printf("Class {");
  for (local_18 = pClass; local_18 != (Ivy_Obj_t *)0x0; local_18 = Ivy_ObjClassNodeNext(local_18)) {
    uVar1 = 0x2d;
    if ((*(uint *)&local_18->field_0x8 >> 7 & 1) != 0) {
      uVar1 = 0x2b;
    }
    printf(" %d(%d)%c",(ulong)(uint)local_18->Id,(ulong)(*(uint *)&local_18->field_0x8 >> 0xb),uVar1
          );
  }
  printf(" }\n");
  return;
}

Assistant:

void Ivy_FraigPrintClass( Ivy_Obj_t * pClass )
{
    Ivy_Obj_t * pObj;
    printf( "Class {" );
    Ivy_FraigForEachClassNode( pClass, pObj )
        printf( " %d(%d)%c", pObj->Id, pObj->Level, pObj->fPhase? '+' : '-' );
    printf( " }\n" );
}